

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNTchr.cpp
# Opt level: O0

void __thiscall NaPNTeacher::initialize(NaPNTeacher *this,bool *starter)

{
  long *plVar1;
  ulong uVar2;
  undefined1 *in_RSI;
  long *in_RDI;
  NaStdBackPropParams *local_18;
  
  *in_RSI = 0;
  *(undefined4 *)((long)in_RDI + 0x1e4) = 0;
  plVar1 = (long *)in_RDI[0x3d];
  local_18 = (NaStdBackPropParams *)0x0;
  if (plVar1 != (long *)0x0) {
    local_18 = (NaStdBackPropParams *)((long)plVar1 + *(long *)(*plVar1 + -0x18));
  }
  NaStdBackPropParams::operator=(local_18,(NaStdBackPropParams *)(in_RDI + 0x34));
  uVar2 = (**(code **)(*in_RDI + 0x18))();
  if ((uVar2 & 1) != 0) {
    NaStdBackProp::SetDebugLevel((NaStdBackProp *)in_RDI[0x3d],2);
  }
  return;
}

Assistant:

void
NaPNTeacher::initialize (bool& starter)
{
    starter = false;
    iUpdateCounter = 0;

    // Assign parameters
    *(NaStdBackPropParams*)bpe = lpar;
    //qprop: *(NaQuickPropParams*)bpe = lpar;

    if(is_verbose())
	bpe->SetDebugLevel(2);
}